

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CloseCurrentPopup(void)

{
  ImVector<ImGuiPopupData> *this;
  ImGuiID IVar1;
  ImGuiWindow_conflict *pIVar2;
  ImGuiContext_conflict1 *pIVar3;
  ImGuiPopupData_conflict1 *pIVar4;
  int iVar5;
  int i;
  
  pIVar3 = GImGui;
  iVar5 = (GImGui->BeginPopupStack).Size;
  if ((0 < iVar5) && (iVar5 <= (GImGui->OpenPopupStack).Size)) {
    iVar5 = iVar5 + -1;
    this = &GImGui->OpenPopupStack;
    pIVar4 = ImVector<ImGuiPopupData>::operator[](&GImGui->BeginPopupStack,iVar5);
    IVar1 = pIVar4->PopupId;
    pIVar4 = ImVector<ImGuiPopupData>::operator[](this,iVar5);
    if (IVar1 == pIVar4->PopupId) {
      while (i = iVar5, 0 < i) {
        pIVar4 = ImVector<ImGuiPopupData>::operator[](this,i);
        pIVar2 = pIVar4->Window;
        iVar5 = i + -1;
        pIVar4 = ImVector<ImGuiPopupData>::operator[](this,iVar5);
        if (((pIVar2 == (ImGuiWindow_conflict *)0x0) || ((pIVar2->Flags & 0x10000000) == 0)) ||
           ((pIVar4->Window != (ImGuiWindow_conflict *)0x0 &&
            ((pIVar4->Window->Flags & 0x8000000) != 0)))) goto LAB_001873f6;
      }
      i = 0;
LAB_001873f6:
      ClosePopupToLevel(i,true);
      if (pIVar3->NavWindow != (ImGuiWindow_conflict *)0x0) {
        (pIVar3->NavWindow->DC).NavHideHighlightOneFrame = true;
      }
    }
  }
  return;
}

Assistant:

void ImGui::CloseCurrentPopup()
{
    ImGuiContext& g = *GImGui;
    int popup_idx = g.BeginPopupStack.Size - 1;
    if (popup_idx < 0 || popup_idx >= g.OpenPopupStack.Size || g.BeginPopupStack[popup_idx].PopupId != g.OpenPopupStack[popup_idx].PopupId)
        return;

    // Closing a menu closes its top-most parent popup (unless a modal)
    while (popup_idx > 0)
    {
        ImGuiWindow* popup_window = g.OpenPopupStack[popup_idx].Window;
        ImGuiWindow* parent_popup_window = g.OpenPopupStack[popup_idx - 1].Window;
        bool close_parent = false;
        if (popup_window && (popup_window->Flags & ImGuiWindowFlags_ChildMenu))
            if (parent_popup_window == NULL || !(parent_popup_window->Flags & ImGuiWindowFlags_Modal))
                close_parent = true;
        if (!close_parent)
            break;
        popup_idx--;
    }
    IMGUI_DEBUG_LOG_POPUP("CloseCurrentPopup %d -> %d\n", g.BeginPopupStack.Size - 1, popup_idx);
    ClosePopupToLevel(popup_idx, true);

    // A common pattern is to close a popup when selecting a menu item/selectable that will open another window.
    // To improve this usage pattern, we avoid nav highlight for a single frame in the parent window.
    // Similarly, we could avoid mouse hover highlight in this window but it is less visually problematic.
    if (ImGuiWindow* window = g.NavWindow)
        window->DC.NavHideHighlightOneFrame = true;
}